

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_loopfilter.c
# Opt level: O2

void av1_filter_block_plane_vert_opt
               (AV1_COMMON *cm,MACROBLOCKD *xd,MACROBLOCKD_PLANE *plane_ptr,uint32_t mi_row,
               uint32_t mi_col,AV1_DEBLOCKING_PARAMETERS *params_buf,TX_SIZE *tx_buf,
               int num_mis_in_lpf_unit_height_log2)

{
  loop_filter_info_n *lfi_n;
  BLOCK_SIZE BVar1;
  uint8_t *puVar2;
  MB_MODE_INFO **ppMVar3;
  MB_MODE_INFO *pMVar4;
  bool bVar5;
  char cVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  MB_MODE_INFO *pMVar12;
  uint8_t *dst;
  byte bVar13;
  uint uVar14;
  int iVar15;
  AV1_DEBLOCKING_PARAMETERS *pAVar16;
  int iVar17;
  byte *pbVar18;
  char cVar19;
  int x;
  int iVar20;
  byte bVar21;
  byte bVar22;
  uint32_t uVar23;
  
  puVar2 = (plane_ptr->dst).buf;
  iVar17 = ((plane_ptr->dst).height + 3 >> 2) - mi_row;
  iVar15 = 1 << ((byte)num_mis_in_lpf_unit_height_log2 & 0x1f);
  if (iVar17 < iVar15) {
    iVar15 = iVar17;
  }
  iVar8 = ((plane_ptr->dst).width + 3 >> 2) - mi_col;
  iVar17 = 0x20;
  if (iVar8 < 0x20) {
    iVar17 = iVar8;
  }
  iVar8 = (plane_ptr->dst).stride;
  uVar10 = (ulong)mi_col;
  lfi_n = &cm->lf_info;
  uVar14 = 0;
  do {
    if (iVar15 <= (int)uVar14) {
      return;
    }
    uVar11 = uVar14 + mi_row;
    params_buf->filter_length = '\0';
    uVar9 = (cm->mi_params).mi_stride * uVar11;
    ppMVar3 = (cm->mi_params).mi_grid_base;
    pMVar4 = ppMVar3[uVar9 + uVar10];
    cVar19 = (char)*(ushort *)&pMVar4->field_0xa7;
    if ((xd == (MACROBLOCKD *)0x0) || (xd->lossless[*(ushort *)&pMVar4->field_0xa7 & 7] == 0)) {
      bVar21 = pMVar4->tx_size;
      if (((cVar19 < '\0') || ('\0' < pMVar4->ref_frame[0])) && (pMVar4->skip_txfm == '\0')) {
        BVar1 = pMVar4->bsize;
        bVar21 = pMVar4->inter_tx_size
                 [((int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                         [BVar1] - 1 & mi_col) >>
                  (av1_get_txb_size_index_tw_w_log2_table[BVar1] & 0x1f)) +
                  (((int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                          [BVar1] - 1 & uVar11) >>
                   (av1_get_txb_size_index_tw_h_log2_table[BVar1] & 0x1f)) <<
                  (av1_get_txb_size_index_stride_log2_table[BVar1] & 0x1f))];
      }
      if (mi_col != 0) {
        pMVar12 = ppMVar3[(ulong)uVar9 + (uVar10 - 1)];
        if (xd != (MACROBLOCKD *)0x0) goto LAB_0031f48e;
        cVar6 = (char)*(undefined2 *)&pMVar12->field_0xa7;
LAB_0031f4cb:
        bVar22 = pMVar12->tx_size;
        if (((cVar6 < '\0') || ('\0' < pMVar12->ref_frame[0])) && (pMVar12->skip_txfm == '\0')) {
          BVar1 = pMVar12->bsize;
          bVar22 = pMVar12->inter_tx_size
                   [((int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                           [BVar1] - 1 & mi_col - 1) >>
                    (av1_get_txb_size_index_tw_w_log2_table[BVar1] & 0x1f)) +
                    (((int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                            [BVar1] - 1 & uVar11) >>
                     (av1_get_txb_size_index_tw_h_log2_table[BVar1] & 0x1f)) <<
                    (av1_get_txb_size_index_stride_log2_table[BVar1] & 0x1f))];
        }
        goto LAB_0031f53b;
      }
      bVar13 = 0x80;
    }
    else if (mi_col == 0) {
      bVar13 = 0x80;
      bVar21 = 0;
    }
    else {
      pMVar12 = ppMVar3[(ulong)uVar9 + (uVar10 - 1)];
      bVar21 = 0;
LAB_0031f48e:
      cVar6 = (char)*(ushort *)&pMVar12->field_0xa7;
      if (xd->lossless[*(ushort *)&pMVar12->field_0xa7 & 7] == 0) goto LAB_0031f4cb;
      bVar22 = 0;
LAB_0031f53b:
      bVar13 = block_size_high[pMVar12->bsize];
      bVar7 = get_filter_level(cm,lfi_n,0,0,pMVar4);
      if (bVar7 == 0) {
        bVar7 = get_filter_level(cm,lfi_n,0,0,pMVar12);
      }
      if (pMVar12 == pMVar4) {
        if (pMVar4->skip_txfm == '\0') {
          bVar5 = true;
        }
        else {
          if (cVar19 < '\0') goto LAB_0031f5e1;
          bVar5 = pMVar4->ref_frame[0] < '\x01';
        }
        if (!bVar5) goto LAB_0031f5e1;
      }
      if (bVar7 != 0) {
        params_buf->filter_length = (uint8_t)vert_filter_length_luma[bVar21][bVar22];
        params_buf->lfthr = lfi_n->lfthr + bVar7;
      }
    }
LAB_0031f5e1:
    bVar22 = block_size_high[pMVar4->bsize];
    if (bVar13 < block_size_high[pMVar4->bsize]) {
      bVar22 = bVar13;
    }
    *tx_buf = bVar21;
    pAVar16 = params_buf;
    pbVar18 = tx_buf;
    uVar23 = mi_col;
    while( true ) {
      iVar20 = tx_size_wide_unit[bVar21];
      uVar23 = uVar23 + iVar20;
      if (iVar17 + mi_col <= uVar23) break;
      pAVar16 = pAVar16 + iVar20;
      pAVar16->filter_length = '\0';
      uVar9 = (cm->mi_params).mi_stride * uVar11;
      ppMVar3 = (cm->mi_params).mi_grid_base;
      pMVar4 = ppMVar3[(ulong)uVar9 + (ulong)uVar23];
      cVar19 = (char)*(ushort *)&pMVar4->field_0xa7;
      if ((xd == (MACROBLOCKD *)0x0) || (xd->lossless[*(ushort *)&pMVar4->field_0xa7 & 7] == 0)) {
        bVar13 = pMVar4->tx_size;
        if (((cVar19 < '\0') || ('\0' < pMVar4->ref_frame[0])) && (pMVar4->skip_txfm == '\0')) {
          BVar1 = pMVar4->bsize;
          bVar13 = pMVar4->inter_tx_size
                   [((int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                           [BVar1] - 1 & uVar23) >>
                    (av1_get_txb_size_index_tw_w_log2_table[BVar1] & 0x1f)) +
                    (((int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                            [BVar1] - 1 & uVar11) >>
                     (av1_get_txb_size_index_tw_h_log2_table[BVar1] & 0x1f)) <<
                    (av1_get_txb_size_index_stride_log2_table[BVar1] & 0x1f))];
        }
      }
      else {
        bVar13 = 0;
      }
      pMVar12 = ppMVar3[(ulong)uVar9 + ((ulong)uVar23 - 1)];
      bVar7 = get_filter_level(cm,lfi_n,0,0,pMVar4);
      if (bVar7 == 0) {
        bVar7 = get_filter_level(cm,lfi_n,0,0,pMVar12);
      }
      if (pMVar12 == pMVar4) {
        if (pMVar4->skip_txfm == '\0') {
          bVar5 = true;
LAB_0031f79a:
          if (bVar5) goto joined_r0x0031f7a0;
        }
        else if (-1 < cVar19) {
          bVar5 = pMVar4->ref_frame[0] < '\x01';
          goto LAB_0031f79a;
        }
      }
      else {
joined_r0x0031f7a0:
        if (bVar7 != 0) {
          pAVar16->filter_length = (uint8_t)vert_filter_length_luma[bVar13][bVar21];
          pAVar16->lfthr = lfi_n->lfthr + bVar7;
        }
      }
      pbVar18 = pbVar18 + iVar20;
      if (block_size_high[pMVar4->bsize] <= bVar22) {
        bVar22 = block_size_high[pMVar4->bsize];
      }
      *pbVar18 = bVar13;
      bVar21 = bVar13;
    }
    if ((((uVar14 & 3) != 0) || (uVar9 = uVar14 | 3, iVar15 <= (int)uVar9)) ||
       (bVar5 = false, bVar22 < 0x10)) {
      uVar9 = uVar14 + 1;
      bVar5 = 7 < bVar22 && (int)uVar9 < iVar15;
      if (7 >= bVar22 || (int)uVar9 >= iVar15) {
        uVar9 = uVar14;
      }
    }
    dst = puVar2 + (int)(uVar14 * iVar8 * 4);
    pbVar18 = tx_buf;
    pAVar16 = params_buf;
    for (iVar20 = 0; iVar20 < iVar17; iVar20 = iVar20 + uVar14) {
      if (*pbVar18 == 0xff) {
        pAVar16->filter_length = '\0';
        *pbVar18 = 0;
      }
      filter_vert(dst,iVar8,pAVar16,cm->seq_params,bVar5);
      uVar14 = tx_size_wide_unit[*pbVar18];
      dst = dst + uVar14 * 4;
      pbVar18 = pbVar18 + uVar14;
      pAVar16 = pAVar16 + uVar14;
    }
    uVar14 = uVar9 + 1;
  } while( true );
}

Assistant:

void av1_filter_block_plane_vert_opt(
    const AV1_COMMON *const cm, const MACROBLOCKD *const xd,
    const MACROBLOCKD_PLANE *const plane_ptr, const uint32_t mi_row,
    const uint32_t mi_col, AV1_DEBLOCKING_PARAMETERS *params_buf,
    TX_SIZE *tx_buf, int num_mis_in_lpf_unit_height_log2) {
  uint8_t *const dst_ptr = plane_ptr->dst.buf;
  const int dst_stride = plane_ptr->dst.stride;
  // Ensure that mi_cols/mi_rows are calculated based on frame dimension aligned
  // to MI_SIZE.
  const int plane_mi_cols =
      CEIL_POWER_OF_TWO(plane_ptr->dst.width, MI_SIZE_LOG2);
  const int plane_mi_rows =
      CEIL_POWER_OF_TWO(plane_ptr->dst.height, MI_SIZE_LOG2);
  // Whenever 'pipeline_lpf_mt_with_enc' is enabled, height of the unit to
  // filter (i.e., y_range) is calculated based on the size of the superblock
  // used.
  const int y_range = AOMMIN((int)(plane_mi_rows - mi_row),
                             (1 << num_mis_in_lpf_unit_height_log2));
  // Width of the unit to filter (i.e., x_range) should always be calculated
  // based on maximum superblock size as this function is called for mi_col = 0,
  // MAX_MIB_SIZE, 2 * MAX_MIB_SIZE etc.
  const int x_range = AOMMIN((int)(plane_mi_cols - mi_col), MAX_MIB_SIZE);
  const ptrdiff_t mode_step = 1;
  for (int y = 0; y < y_range; y++) {
    const uint32_t curr_y = mi_row + y;
    const uint32_t x_start = mi_col;
    const uint32_t x_end = mi_col + x_range;
    int min_block_height = block_size_high[BLOCK_128X128];
    set_lpf_parameters_for_line_luma(params_buf, tx_buf, cm, xd, VERT_EDGE,
                                     x_start, curr_y, plane_ptr, x_end,
                                     mode_step, &min_block_height);

    AV1_DEBLOCKING_PARAMETERS *params = params_buf;
    TX_SIZE *tx_size = tx_buf;
    USE_FILTER_TYPE use_filter_type = USE_SINGLE;

    uint8_t *p = dst_ptr + y * MI_SIZE * dst_stride;

    if ((y & 3) == 0 && (y + 3) < y_range && min_block_height >= 16) {
      // If we are on a row which is a multiple of 4, and the minimum height is
      // 16 pixels, then the current and right 3 cols must contain the same
      // prediction block. This is because dim 16 can only happen every unit of
      // 4 mi's.
      use_filter_type = USE_QUAD;
      y += 3;
    } else if ((y + 1) < y_range && min_block_height >= 8) {
      use_filter_type = USE_DUAL;
      y += 1;
    }

    for (int x = 0; x < x_range;) {
      if (*tx_size == TX_INVALID) {
        params->filter_length = 0;
        *tx_size = TX_4X4;
      }

      filter_vert(p, dst_stride, params, cm->seq_params, use_filter_type);

      // advance the destination pointer
      const uint32_t advance_units = tx_size_wide_unit[*tx_size];
      x += advance_units;
      p += advance_units * MI_SIZE;
      params += advance_units;
      tx_size += advance_units;
    }
  }
}